

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr,int rMayHaveNull,int isRowid)

{
  u8 uVar1;
  ExprList *pEVar2;
  Parse *pPVar3;
  undefined4 uVar4;
  uint addr;
  int iVar5;
  int p1;
  Vdbe *p;
  Expr *pEVar6;
  char *pcVar7;
  ExprList_item *pEVar8;
  Select *pSVar9;
  int iVar10;
  char affinity;
  uint local_8c;
  int local_88;
  int local_84;
  Parse *local_80;
  Expr *local_78;
  int local_70;
  int local_6c;
  KeyInfo keyInfo;
  int iValToIns;
  int local_3c;
  undefined8 local_38;
  
  local_84 = isRowid;
  p = sqlite3GetVdbe(pParse);
  if (p == (Vdbe *)0x0) {
    iVar10 = 0;
  }
  else {
    pParse->iCacheLevel = pParse->iCacheLevel + 1;
    if ((pExpr->flags & 0x20) == 0) {
      addr = sqlite3CodeOnce(pParse);
    }
    else {
      addr = 0xffffffff;
    }
    if (pParse->explain == '\x02') {
      pcVar7 = "CORRELATED ";
      if (-1 < (int)addr) {
        pcVar7 = "";
      }
      pcVar7 = sqlite3MPrintf(pParse->db,"EXECUTE %s%s SUBQUERY %d",pcVar7);
      sqlite3VdbeAddOp4(p,0x96,pParse->iSelectId,0,0,pcVar7,-1);
    }
    uVar4 = keyInfo.db._0_4_;
    uVar1 = pExpr->op;
    local_80 = pParse;
    if (uVar1 == 'H') {
      pEVar6 = pExpr->pLeft;
      local_78 = pExpr;
      if (rMayHaveNull != 0) {
        sqlite3VdbeAddOp2(p,10,0,rMayHaveNull);
      }
      affinity = sqlite3ExprAffinity(pEVar6);
      pEVar6 = local_78;
      local_8c = CONCAT31(local_8c._1_3_,affinity);
      iVar10 = pParse->nTab;
      pParse->nTab = iVar10 + 1;
      local_78->iTable = iVar10;
      iVar5 = 0x2a;
      local_6c = sqlite3VdbeAddOp2(p,0x2a,iVar10,(uint)(local_84 == 0));
      pPVar3 = local_80;
      if ((rMayHaveNull == 0) && (p->aOp != (Op *)0x0)) {
        p->aOp[(long)p->nOp + -1].p5 = '\b';
      }
      keyInfo.db = (sqlite3 *)0x0;
      keyInfo.aColl[0] = (CollSeq *)0x0;
      keyInfo.enc = '\0';
      keyInfo._9_1_ = 0;
      keyInfo.nField = 1;
      keyInfo._12_4_ = 0;
      keyInfo.aSortOrder = &sqlite3CodeSubselect::sortOrder;
      if ((pEVar6->flags & 0x800) == 0) {
        pEVar2 = (pEVar6->x).pList;
        pParse = local_80;
        if (pEVar2 != (ExprList *)0x0) {
          if ((char)local_8c == '\0') {
            affinity = 'b';
          }
          keyInfo.aColl[0] = sqlite3ExprCollSeq(local_80,local_78->pLeft);
          keyInfo.aSortOrder = &sqlite3CodeSubselect::sortOrder;
          local_70 = sqlite3GetTempReg(pPVar3);
          local_88 = sqlite3GetTempReg(pPVar3);
          sqlite3VdbeAddOp2(p,10,0,local_88);
          pEVar8 = pEVar2->a;
          for (iVar10 = pEVar2->nExpr; pParse = local_80, 0 < iVar10; iVar10 = iVar10 + -1) {
            pEVar6 = pEVar8->pExpr;
            if ((-1 < (int)addr) && (iVar5 = sqlite3ExprIsConstant(pEVar6), iVar5 == 0)) {
              sqlite3VdbeChangeToNoop(p,addr);
              addr = 0xffffffff;
            }
            if ((local_84 == 0) || (iVar5 = sqlite3ExprIsInteger(pEVar6,&iValToIns), iVar5 == 0)) {
              pPVar3 = local_80;
              local_8c = addr;
              p1 = sqlite3ExprCodeTarget(local_80,pEVar6,local_70);
              iVar5 = local_88;
              if (local_84 == 0) {
                sqlite3VdbeAddOp4(p,0x1f,p1,1,local_88,&affinity,1);
                sqlite3ExprCacheRemove(pPVar3,p1,1);
                sqlite3VdbeAddOp2(p,0x61,local_78->iTable,iVar5);
                addr = local_8c;
              }
              else {
                sqlite3VdbeAddOp2(p,0x15,p1,p->nOp + 2);
                sqlite3VdbeAddOp3(p,0x39,local_78->iTable,local_88,p1);
                addr = local_8c;
              }
            }
            else {
              sqlite3VdbeAddOp3(p,0x3a,local_78->iTable,local_88,iValToIns);
            }
            pEVar8 = pEVar8 + 1;
          }
          sqlite3ReleaseTempReg(local_80,local_70);
          iVar5 = local_88;
          sqlite3ReleaseTempReg(pParse,local_88);
        }
      }
      else {
        local_3c = pEVar6->iTable;
        local_38._0_4_ = 0;
        local_38._4_4_ = 0;
        iValToIns._0_2_ = CONCAT11((char)local_8c,7);
        ((pEVar6->x).pSelect)->iLimit = 0;
        pSVar9 = (pEVar6->x).pSelect;
        iVar10 = sqlite3Select(pParse,pSVar9,(SelectDest *)&iValToIns);
        iVar5 = (int)pSVar9;
        if (iVar10 != 0) {
          return 0;
        }
        pEVar2 = ((pEVar6->x).pSelect)->pEList;
        if ((pEVar2 != (ExprList *)0x0) && (0 < pEVar2->nExpr)) {
          pEVar6 = pEVar6->pLeft;
          keyInfo.aColl[0] = sqlite3BinaryCompareCollSeq(pParse,pEVar6,pEVar2->a->pExpr);
          iVar5 = (int)pEVar6;
        }
      }
      if (local_84 == 0) {
        iVar5 = local_6c;
        sqlite3VdbeChangeP4(p,local_6c,(char *)&keyInfo,-6);
      }
      iVar10 = 0;
    }
    else {
      pSVar9 = (pExpr->x).pSelect;
      iVar10 = pParse->nMem + 1;
      pParse->nMem = iVar10;
      keyInfo.db = (sqlite3 *)CONCAT44(iVar10,keyInfo.db._0_4_);
      keyInfo.db._0_2_ = CONCAT11(0,(byte)uVar4);
      keyInfo.enc = '\0';
      keyInfo._9_1_ = 0;
      keyInfo.nField = 0;
      keyInfo._12_4_ = 0;
      sqlite3VdbeAddOp2(p,(uint)(uVar1 == 't') * 3 + 7,0,iVar10);
      pParse = local_80;
      keyInfo.db = (sqlite3 *)CONCAT71(keyInfo.db._1_7_,(uVar1 == 't') * '\x03' + '\x03');
      sqlite3ExprDelete(local_80->db,pSVar9->pLimit);
      pEVar6 = sqlite3PExpr(pParse,0x81,(Expr *)0x0,(Expr *)0x0,sqlite3IntTokens + 1);
      pSVar9->pLimit = pEVar6;
      pSVar9->iLimit = 0;
      iVar10 = sqlite3Select(pParse,pSVar9,(SelectDest *)&keyInfo);
      iVar5 = (int)pSVar9;
      if (iVar10 != 0) {
        return 0;
      }
      iVar10 = keyInfo.db._4_4_;
    }
    if ((-1 < (int)addr) && (addr < (uint)p->nOp)) {
      p->aOp[addr].p2 = p->nOp;
    }
    sqlite3ExprCachePop(pParse,iVar5);
  }
  return iVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN, SELECT, or EXISTS operator */
  int rMayHaveNull,       /* Register that records whether NULLs exist in RHS */
  int isRowid             /* If true, LHS of IN operator is a rowid */
){
  int testAddr = -1;                      /* One-time test address */
  int rReg = 0;                           /* Register storing resulting */
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return 0;
  sqlite3ExprCachePush(pParse);

  /* This code must be run in its entirety every time it is encountered
  ** if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasAnyProperty(pExpr, EP_VarSelect) ){
    testAddr = sqlite3CodeOnce(pParse);
  }

#ifndef SQLITE_OMIT_EXPLAIN
  if( pParse->explain==2 ){
    char *zMsg = sqlite3MPrintf(
        pParse->db, "EXECUTE %s%s SUBQUERY %d", testAddr>=0?"":"CORRELATED ",
        pExpr->op==TK_IN?"LIST":"SCALAR", pParse->iNextSelectId
    );
    sqlite3VdbeAddOp4(v, OP_Explain, pParse->iSelectId, 0, 0, zMsg, P4_DYNAMIC);
  }
#endif

  switch( pExpr->op ){
    case TK_IN: {
      char affinity;              /* Affinity of the LHS of the IN */
      KeyInfo keyInfo;            /* Keyinfo for the generated table */
      static u8 sortOrder = 0;    /* Fake aSortOrder for keyInfo */
      int addr;                   /* Address of OP_OpenEphemeral instruction */
      Expr *pLeft = pExpr->pLeft; /* the LHS of the IN operator */

      if( rMayHaveNull ){
        sqlite3VdbeAddOp2(v, OP_Null, 0, rMayHaveNull);
      }

      affinity = sqlite3ExprAffinity(pLeft);

      /* Whether this is an 'x IN(SELECT...)' or an 'x IN(<exprlist>)'
      ** expression it is handled the same way.  An ephemeral table is 
      ** filled with single-field index keys representing the results
      ** from the SELECT or the <exprlist>.
      **
      ** If the 'x' expression is a column value, or the SELECT...
      ** statement returns a column value, then the affinity of that
      ** column is used to build the index keys. If both 'x' and the
      ** SELECT... statement are columns, then numeric affinity is used
      ** if either column has NUMERIC or INTEGER affinity. If neither
      ** 'x' nor the SELECT... statement are columns, then numeric affinity
      ** is used.
      */
      pExpr->iTable = pParse->nTab++;
      addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pExpr->iTable, !isRowid);
      if( rMayHaveNull==0 ) sqlite3VdbeChangeP5(v, BTREE_UNORDERED);
      memset(&keyInfo, 0, sizeof(keyInfo));
      keyInfo.nField = 1;
      keyInfo.aSortOrder = &sortOrder;

      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* Case 1:     expr IN (SELECT ...)
        **
        ** Generate code to write the results of the select into the temporary
        ** table allocated and opened above.
        */
        SelectDest dest;
        ExprList *pEList;

        assert( !isRowid );
        sqlite3SelectDestInit(&dest, SRT_Set, pExpr->iTable);
        dest.affSdst = (u8)affinity;
        assert( (pExpr->iTable&0x0000FFFF)==pExpr->iTable );
        pExpr->x.pSelect->iLimit = 0;
        if( sqlite3Select(pParse, pExpr->x.pSelect, &dest) ){
          return 0;
        }
        pEList = pExpr->x.pSelect->pEList;
        if( ALWAYS(pEList!=0 && pEList->nExpr>0) ){ 
          keyInfo.aColl[0] = sqlite3BinaryCompareCollSeq(pParse, pExpr->pLeft,
              pEList->a[0].pExpr);
        }
      }else if( ALWAYS(pExpr->x.pList!=0) ){
        /* Case 2:     expr IN (exprlist)
        **
        ** For each expression, build an index key from the evaluation and
        ** store it in the temporary table. If <expr> is a column, then use
        ** that columns affinity when building index keys. If <expr> is not
        ** a column, use numeric affinity.
        */
        int i;
        ExprList *pList = pExpr->x.pList;
        struct ExprList_item *pItem;
        int r1, r2, r3;

        if( !affinity ){
          affinity = SQLITE_AFF_NONE;
        }
        keyInfo.aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
        keyInfo.aSortOrder = &sortOrder;

        /* Loop through each expression in <exprlist>. */
        r1 = sqlite3GetTempReg(pParse);
        r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Null, 0, r2);
        for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
          Expr *pE2 = pItem->pExpr;
          int iValToIns;

          /* If the expression is not constant then we will need to
          ** disable the test that was generated above that makes sure
          ** this code only executes once.  Because for a non-constant
          ** expression we need to rerun this code each time.
          */
          if( testAddr>=0 && !sqlite3ExprIsConstant(pE2) ){
            sqlite3VdbeChangeToNoop(v, testAddr);
            testAddr = -1;
          }

          /* Evaluate the expression and insert it into the temp table */
          if( isRowid && sqlite3ExprIsInteger(pE2, &iValToIns) ){
            sqlite3VdbeAddOp3(v, OP_InsertInt, pExpr->iTable, r2, iValToIns);
          }else{
            r3 = sqlite3ExprCodeTarget(pParse, pE2, r1);
            if( isRowid ){
              sqlite3VdbeAddOp2(v, OP_MustBeInt, r3,
                                sqlite3VdbeCurrentAddr(v)+2);
              sqlite3VdbeAddOp3(v, OP_Insert, pExpr->iTable, r2, r3);
            }else{
              sqlite3VdbeAddOp4(v, OP_MakeRecord, r3, 1, r2, &affinity, 1);
              sqlite3ExprCacheAffinityChange(pParse, r3, 1);
              sqlite3VdbeAddOp2(v, OP_IdxInsert, pExpr->iTable, r2);
            }
          }
        }
        sqlite3ReleaseTempReg(pParse, r1);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      if( !isRowid ){
        sqlite3VdbeChangeP4(v, addr, (void *)&keyInfo, P4_KEYINFO);
      }
      break;
    }

    case TK_EXISTS:
    case TK_SELECT:
    default: {
      /* If this has to be a scalar SELECT.  Generate code to put the
      ** value of this select in a memory cell and record the number
      ** of the memory cell in iColumn.  If this is an EXISTS, write
      ** an integer 0 (not exists) or 1 (exists) into a memory cell
      ** and record that memory cell in iColumn.
      */
      Select *pSel;                         /* SELECT statement to encode */
      SelectDest dest;                      /* How to deal with SELECt result */

      testcase( pExpr->op==TK_EXISTS );
      testcase( pExpr->op==TK_SELECT );
      assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );

      assert( ExprHasProperty(pExpr, EP_xIsSelect) );
      pSel = pExpr->x.pSelect;
      sqlite3SelectDestInit(&dest, 0, ++pParse->nMem);
      if( pExpr->op==TK_SELECT ){
        dest.eDest = SRT_Mem;
        sqlite3VdbeAddOp2(v, OP_Null, 0, dest.iSDParm);
        VdbeComment((v, "Init subquery result"));
      }else{
        dest.eDest = SRT_Exists;
        sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
        VdbeComment((v, "Init EXISTS result"));
      }
      sqlite3ExprDelete(pParse->db, pSel->pLimit);
      pSel->pLimit = sqlite3PExpr(pParse, TK_INTEGER, 0, 0,
                                  &sqlite3IntTokens[1]);
      pSel->iLimit = 0;
      if( sqlite3Select(pParse, pSel, &dest) ){
        return 0;
      }
      rReg = dest.iSDParm;
      ExprSetIrreducible(pExpr);
      break;
    }
  }

  if( testAddr>=0 ){
    sqlite3VdbeJumpHere(v, testAddr);
  }
  sqlite3ExprCachePop(pParse, 1);

  return rReg;
}